

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

bool __thiscall Func::DoRecordNativeMap(Func *this)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  
  bVar1 = true;
  if (!VTuneChakraProfile::isJitProfilingActive) {
    sourceContextId = GetSourceContextId(this);
    functionId = GetLocalFunctionId(this);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01433318,EncoderPhase,sourceContextId,functionId);
    bVar1 = (bool)(bVar1 & DAT_0145948a);
  }
  return bVar1;
}

Assistant:

bool Func::DoRecordNativeMap() const
{
#if defined(VTUNE_PROFILING)
    if (VTuneChakraProfile::isJitProfilingActive)
    {
        return true;
    }
#endif
#if DBG_DUMP
    return PHASE_DUMP(Js::EncoderPhase, this) && Js::Configuration::Global.flags.Verbose;
#else
    return false;
#endif
}